

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_string_append_unicode
                  (archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  archive_string *paVar1;
  long lVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  _func_size_t_char_ptr_size_t_uint32_t *unparse;
  _func_wchar_t_uint32_t_ptr_char_ptr_size_t *parse;
  wchar_t tm;
  wchar_t ts;
  wchar_t ret;
  wchar_t n;
  size_t w;
  uint32_t uc;
  char *endp;
  char *p;
  char *s;
  code *s_00;
  code *as_00;
  int local_5c;
  wchar_t local_58;
  int local_54;
  undefined4 local_44;
  long local_40;
  long local_38;
  long local_30;
  long local_20;
  long local_18;
  long *local_10;
  wchar_t local_4;
  
  local_58 = L'\0';
  if ((*(uint *)(in_RCX + 0x24) & 0x400) == 0) {
    if ((*(uint *)(in_RCX + 0x24) & 0x1000) == 0) {
      if ((*(uint *)(in_RCX + 0x24) & 0x100) == 0) {
        if ((*(uint *)(in_RCX + 0x24) & 0x800) == 0) {
          if ((*(uint *)(in_RCX + 0x24) & 0x2000) == 0) {
            s_00 = unicode_to_utf8;
            local_5c = 1;
          }
          else {
            s_00 = unicode_to_utf16le;
            local_5c = 2;
          }
        }
        else {
          s_00 = unicode_to_utf16be;
          local_5c = 2;
        }
      }
      else {
        s_00 = unicode_to_utf8;
        local_5c = 1;
      }
    }
    else {
      s_00 = unicode_to_utf16le;
      local_5c = 2;
    }
  }
  else {
    s_00 = unicode_to_utf16be;
    local_5c = 2;
  }
  if ((*(uint *)(in_RCX + 0x24) & 0x800) == 0) {
    if ((*(uint *)(in_RCX + 0x24) & 0x2000) == 0) {
      as_00 = cesu8_to_unicode;
    }
    else {
      as_00 = utf16le_to_unicode;
    }
  }
  else {
    as_00 = utf16be_to_unicode;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  paVar1 = archive_string_ensure((archive_string *)as_00,(size_t)s_00);
  if (paVar1 == (archive_string *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_30 = local_18;
    local_38 = *local_10 + local_10[1];
    local_40 = (*local_10 + local_10[2]) - (long)local_5c;
    while (local_54 = (*as_00)(&local_44,local_30,local_20), local_54 != 0) {
      if (local_54 < 0) {
        local_54 = -local_54;
        local_58 = L'\xffffffff';
      }
      local_30 = local_30 + local_54;
      local_20 = local_20 - local_54;
      while (lVar2 = (*s_00)(local_38,local_40 - local_38,local_44), lVar2 == 0) {
        local_10[1] = local_38 - *local_10;
        paVar1 = archive_string_ensure((archive_string *)as_00,(size_t)s_00);
        if (paVar1 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_38 = *local_10 + local_10[1];
        local_40 = (*local_10 + local_10[2]) - (long)local_5c;
      }
      local_38 = lVar2 + local_38;
    }
    local_10[1] = local_38 - *local_10;
    *(undefined1 *)(*local_10 + local_10[1]) = 0;
    if (local_5c == 2) {
      *(undefined1 *)(*local_10 + 1 + local_10[1]) = 0;
    }
    local_4 = local_58;
  }
  return local_4;
}

Assistant:

static int
archive_string_append_unicode(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	uint32_t uc;
	size_t w;
	int n, ret = 0, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		ts = 1;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
			ts = 1;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		if (n < 0) {
			/* Use a replaced unicode character. */
			n *= -1;
			ret = -1;
		}
		s += n;
		len -= n;
		while ((w = unparse(p, endp - p, uc)) == 0) {
			/* There is not enough output buffer so
			 * we have to expand it. */
			as->length = p - as->s;
			if (archive_string_ensure(as,
			    as->buffer_length + len * tm + ts) == NULL)
				return (-1);
			p = as->s + as->length;
			endp = as->s + as->buffer_length - ts;
		}
		p += w;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}